

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

void __thiscall cmServer::StartShutDown(cmServer *this)

{
  bool bVar1;
  element_type *this_00;
  cmServer *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->fileMonitor);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<cmFileMonitor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cmFileMonitor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->fileMonitor);
    cmFileMonitor::StopMonitoring(this_00);
    std::__shared_ptr<cmFileMonitor,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->fileMonitor).super___shared_ptr<cmFileMonitor,_(__gnu_cxx::_Lock_policy)2>);
  }
  cmServerBase::StartShutDown(&this->super_cmServerBase);
  return;
}

Assistant:

void cmServer::StartShutDown()
{
  if (fileMonitor) {
    fileMonitor->StopMonitoring();
    fileMonitor.reset();
  }
  cmServerBase::StartShutDown();
}